

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.H
# Opt level: O3

void __thiscall
amrex::ParmParse::get<double,3ul>(ParmParse *this,char *name,array<double,_3UL> *ref)

{
  size_t i;
  long lVar1;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> local_28;
  
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getarr(this,name,&local_28,0,-1);
  if ((ulong)((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x11) {
    Assert_host("v.size() >= N",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_ParmParse.H"
                ,0x3a0,(char *)0x0);
  }
  lVar1 = 0;
  do {
    ref->_M_elems[lVar1] =
         local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

void get (const char* name, std::array<T,N>& ref) const {
        std::vector<T> v;
        this->getarr(name, v);
        AMREX_ALWAYS_ASSERT(v.size() >= N);
        for (std::size_t i = 0; i < N; ++i) {
            ref[i] = v[i];
        }
    }